

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O2

int32_t lj_vm_modi(int32_t a,int32_t b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = -a;
  if (0 < a) {
    uVar1 = a;
  }
  uVar2 = -b;
  if (0 < b) {
    uVar2 = b;
  }
  uVar3 = uVar1 % uVar2 - ((a ^ b) >> 0x1f & uVar2);
  if (uVar1 % uVar2 == 0) {
    uVar3 = 0;
  }
  uVar1 = -uVar3;
  if (-1 < (int)(b ^ uVar3)) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

int32_t LJ_FASTCALL lj_vm_modi(int32_t a, int32_t b)
{
  uint32_t y, ua, ub;
  /* This must be checked before using this function. */
  lj_assertX(b != 0, "modulo with zero divisor");
  ua = a < 0 ? (uint32_t)-a : (uint32_t)a;
  ub = b < 0 ? (uint32_t)-b : (uint32_t)b;
  y = ua % ub;
  if (y != 0 && (a^b) < 0) y = y - ub;
  if (((int32_t)y^b) < 0) y = (uint32_t)-(int32_t)y;
  return (int32_t)y;
}